

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O0

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,ifstream *ifs)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char c;
  allocator<char> local_39;
  string local_38;
  ifstream *local_18;
  ifstream *ifs_local;
  JsonReader *this_local;
  
  local_18 = ifs;
  ifs_local = (ifstream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  JsonReader(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (cVar2 = std::istream::get(), cVar2 != -1) {
      std::__cxx11::string::operator+=((string *)this,cVar2);
    }
    iVar3 = std::__cxx11::string::size();
    this->__len = iVar3;
  }
  return;
}

Assistant:

explicit JsonReader(std::ifstream &ifs) : JsonReader("") {
            if (ifs.is_open()) {
                char c;
                while ((c = ifs.get()) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }